

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O0

void test_write_two_buffers_partial_write(void)

{
  char *pcVar1;
  int iVar2;
  cio_error cVar3;
  memory_stream *ms;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 local_c8 [4];
  cio_error err;
  cio_read_buffer rb;
  uint8_t buffer [40];
  undefined1 local_78 [8];
  cio_write_buffer wb2;
  cio_write_buffer wb1;
  cio_write_buffer wbh;
  int dummy_context;
  client *client;
  
  ms = (memory_stream *)malloc(0x100);
  cio_write_buffer_head_init((cio_write_buffer *)((long)&wb1.data + 8));
  pcVar1 = test_write_two_buffers_partial_write::test_data;
  sVar4 = strlen(test_write_two_buffers_partial_write::test_data);
  cio_write_buffer_const_element_init((cio_write_buffer *)((long)&wb2.data + 8),pcVar1,sVar4 >> 1);
  cio_write_buffer_queue_tail
            ((cio_write_buffer *)((long)&wb1.data + 8),(cio_write_buffer *)((long)&wb2.data + 8));
  pcVar1 = test_write_two_buffers_partial_write::test_data;
  sVar4 = strlen(test_write_two_buffers_partial_write::test_data);
  sVar5 = strlen(test_write_two_buffers_partial_write::test_data);
  sVar6 = strlen(test_write_two_buffers_partial_write::test_data);
  cio_write_buffer_const_element_init
            ((cio_write_buffer *)local_78,pcVar1 + (sVar4 >> 1),sVar5 - (sVar6 >> 1));
  cio_write_buffer_queue_tail
            ((cio_write_buffer *)((long)&wb1.data + 8),(cio_write_buffer *)local_78);
  iVar2 = memory_stream_init(ms,"");
  UnityAssertEqualNumber
            (0,(long)iVar2,"Could not allocate memory for test!",0x503,UNITY_DISPLAY_STYLE_INT);
  write_some_fake.custom_fake = write_some_first_write_partial;
  cVar3 = cio_read_buffer_init((cio_read_buffer *)local_c8,&rb.fetch_ptr,0x28);
  UnityAssertEqualNumber
            (0,(long)cVar3,"Read buffer was not initialized correctly!",0x509,
             UNITY_DISPLAY_STYLE_INT);
  cVar3 = cio_buffered_stream_init((cio_buffered_stream *)(ms + 1),(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar3,"Buffer was not initialized correctly!",0x50c,UNITY_DISPLAY_STYLE_INT);
  cVar3 = cio_buffered_stream_write
                    ((cio_buffered_stream *)(ms + 1),(cio_write_buffer *)((long)&wb1.data + 8),
                     dummy_write_handler,(void *)((long)&wbh.data + 0xc));
  UnityAssertEqualNumber(0,(long)cVar3,"Return value not correct!",0x50e,UNITY_DISPLAY_STYLE_INT);
  cVar3 = cio_buffered_stream_close((cio_buffered_stream *)(ms + 1));
  UnityAssertEqualNumber(0,(long)cVar3,"Return value not correct!",0x511,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x512,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)dummy_write_handler_fake.call_count,"Handler was not called!",0x513,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)(ms + 1),(UNITY_INT)dummy_write_handler_fake.arg0_val,
             "Handler was not called with original buffered_stream!",0x514,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)((long)&wbh.data + 0xc),(UNITY_INT)dummy_write_handler_fake.arg1_val,
             "Handler was not called with correct context!",0x515,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)dummy_write_handler_fake.arg2_val,"Handler was not called with CIO_SUCCESS!",
             0x516,UNITY_DISPLAY_STYLE_INT);
  pcVar1 = test_write_two_buffers_partial_write::test_data;
  sVar4 = strlen(test_write_two_buffers_partial_write::test_data);
  iVar2 = memcmp(write_check_buffer,pcVar1,sVar4);
  if (iVar2 == 0) {
    return;
  }
  UnityFail("Data was not written correctly!",0x517);
}

Assistant:

static void test_write_two_buffers_partial_write(void)
{
	static const char *test_data = "HelloWorld";
	struct client *client = malloc(sizeof(*client));
	int dummy_context;

	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);
	struct cio_write_buffer wb1;
	cio_write_buffer_const_element_init(&wb1, test_data, strlen(test_data) / 2);
	cio_write_buffer_queue_tail(&wbh, &wb1);
	struct cio_write_buffer wb2;
	cio_write_buffer_const_element_init(&wb2, test_data + (strlen(test_data) / 2), strlen(test_data) - strlen(test_data) / 2);
	cio_write_buffer_queue_tail(&wbh, &wb2);

	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, ""), "Could not allocate memory for test!");
	write_some_fake.custom_fake = write_some_first_write_partial;

	uint8_t buffer[40];
	struct cio_read_buffer rb;
	enum cio_error err = cio_read_buffer_init(&rb, &buffer, sizeof(buffer));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Read buffer was not initialized correctly!");

	err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");
	err = cio_buffered_stream_write(&client->bs, &wbh, dummy_write_handler, &dummy_context);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
	TEST_ASSERT_EQUAL_MESSAGE(1, dummy_write_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(&client->bs, dummy_write_handler_fake.arg0_val, "Handler was not called with original buffered_stream!");
	TEST_ASSERT_EQUAL_MESSAGE(&dummy_context, dummy_write_handler_fake.arg1_val, "Handler was not called with correct context!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, dummy_write_handler_fake.arg2_val, "Handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_MESSAGE(memcmp((const char *)write_check_buffer, test_data, strlen(test_data)) == 0, "Data was not written correctly!");
}